

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O3

bool __thiscall QSslConfiguration::isNull(QSslConfiguration *this)

{
  QSslConfigurationPrivate *pQVar1;
  QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
  *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QSslDiffieHellmanParameters QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (((((pQVar1->protocol == SecureProtocols) && (pQVar1->peerVerifyMode == AutoVerifyPeer)) &&
       (pQVar1->peerVerifyDepth == 0)) &&
      ((pQVar1->allowRootCertOnDemandLoading == true && ((pQVar1->caCertificates).d.size == 0)))) &&
     (((pQVar1->ciphers).d.size == 0 && ((pQVar1->ellipticCurves).d.size == 0)))) {
    bVar3 = QSslKey::isNull(&pQVar1->ephemeralServerKey);
    if (bVar3) {
      pQVar1 = (this->d).d.ptr;
      QSslDiffieHellmanParameters::defaultParameters();
      bVar3 = QSslDiffieHellmanParameters::isEqual(&pQVar1->dhParams,&QStack_28);
      if ((bVar3) && (pQVar1 = (this->d).d.ptr, (pQVar1->localCertificateChain).d.size == 0)) {
        bVar3 = QSslKey::isNull(&pQVar1->privateKey);
        if (!bVar3) goto LAB_00245a96;
        bVar3 = QSslCertificate::isNull(&((this->d).d.ptr)->peerCertificate);
        if (((((!bVar3) || (pQVar1 = (this->d).d.ptr, (pQVar1->peerCertificateChain).d.size != 0))
             || ((pQVar2 = (pQVar1->backendConfig).d.d.ptr,
                 pQVar2 != (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
                            *)0x0 && (*(size_t *)((long)&(pQVar2->m)._M_t._M_impl + 0x28) != 0))))
            || ((((pQVar1->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                  super_QFlagsStorage<QSsl::SslOption>.i != 0x55 ||
                 ((pQVar1->sslSession).d.ptr != (char *)0x0)) ||
                (pQVar1->sslSessionTicketLifeTimeHint != -1)))) ||
           ((((pQVar1->preSharedKeyIdentityHint).d.ptr != (char *)0x0 ||
             ((pQVar1->nextAllowedProtocols).d.size != 0)) ||
            (((pQVar1->nextNegotiatedProtocol).d.ptr != (char *)0x0 ||
             (((pQVar1->nextProtocolNegotiationStatus != NextProtocolNegotiationNone ||
               (pQVar1->ocspStaplingEnabled != false)) || (pQVar1->reportFromCallback != false))))))
           )) goto LAB_00245a96;
        bVar3 = pQVar1->missingCertIsFatal == false;
      }
      else {
LAB_00245a96:
        bVar3 = false;
      }
      QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters(&QStack_28);
      goto LAB_00245aa4;
    }
  }
  bVar3 = false;
LAB_00245aa4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslConfiguration::isNull() const
{
    return (d->protocol == QSsl::SecureProtocols &&
            d->peerVerifyMode == QSslSocket::AutoVerifyPeer &&
            d->peerVerifyDepth == 0 &&
            d->allowRootCertOnDemandLoading == true &&
            d->caCertificates.size() == 0 &&
            d->ciphers.size() == 0 &&
            d->ellipticCurves.isEmpty() &&
            d->ephemeralServerKey.isNull() &&
            d->dhParams == QSslDiffieHellmanParameters::defaultParameters() &&
            d->localCertificateChain.isEmpty() &&
            d->privateKey.isNull() &&
            d->peerCertificate.isNull() &&
            d->peerCertificateChain.size() == 0 &&
            d->backendConfig.isEmpty() &&
            d->sslOptions == QSslConfigurationPrivate::defaultSslOptions &&
            d->sslSession.isNull() &&
            d->sslSessionTicketLifeTimeHint == -1 &&
            d->preSharedKeyIdentityHint.isNull() &&
            d->nextAllowedProtocols.isEmpty() &&
            d->nextNegotiatedProtocol.isNull() &&
            d->nextProtocolNegotiationStatus == QSslConfiguration::NextProtocolNegotiationNone &&
            d->ocspStaplingEnabled == false &&
            d->reportFromCallback == false &&
            d->missingCertIsFatal == false);
}